

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

FlowEdge * __thiscall
FlowGraph::AddEdge(FlowGraph *this,BasicBlock *blockPred,BasicBlock *blockSucc)

{
  FlowEdge *this_00;
  FlowEdge *edge;
  BasicBlock *blockSucc_local;
  BasicBlock *blockPred_local;
  FlowGraph *this_local;
  
  this_00 = FlowEdge::New(this);
  FlowEdge::SetPred(this_00,blockPred);
  FlowEdge::SetSucc(this_00,blockSucc);
  BasicBlock::AddSucc(blockPred,this_00,this);
  BasicBlock::AddPred(blockSucc,this_00,this);
  return this_00;
}

Assistant:

FlowEdge *
FlowGraph::AddEdge(BasicBlock * blockPred, BasicBlock * blockSucc)
{
    FlowEdge * edge = FlowEdge::New(this);
    edge->SetPred(blockPred);
    edge->SetSucc(blockSucc);
    blockPred->AddSucc(edge, this);
    blockSucc->AddPred(edge, this);

    return edge;
}